

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void setIdleInhibitor(_GLFWwindow *window,GLFWbool enable)

{
  zwp_idle_inhibitor_v1 *pzVar1;
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_00000008;
  uint in_stack_fffffffffffffff0;
  
  if (((in_ESI == 0) || (*(long *)(in_RDI + 0x450) != 0)) ||
     (_glfw.wl.idleInhibitManager == (zwp_idle_inhibit_manager_v1 *)0x0)) {
    if ((in_ESI == 0) && (*(long *)(in_RDI + 0x450) != 0)) {
      zwp_idle_inhibitor_v1_destroy((zwp_idle_inhibitor_v1 *)(ulong)in_stack_fffffffffffffff0);
      *(undefined8 *)(in_RDI + 0x450) = 0;
    }
  }
  else {
    pzVar1 = zwp_idle_inhibit_manager_v1_create_inhibitor
                       ((zwp_idle_inhibit_manager_v1 *)window,
                        (wl_surface *)CONCAT44(enable,in_stack_00000008));
    *(zwp_idle_inhibitor_v1 **)(in_RDI + 0x450) = pzVar1;
    if (*(long *)(in_RDI + 0x450) == 0) {
      _glfwInputError(0x10008,"Wayland: Failed to create idle inhibitor");
    }
  }
  return;
}

Assistant:

static void setIdleInhibitor(_GLFWwindow* window, GLFWbool enable)
{
    if (enable && !window->wl.idleInhibitor && _glfw.wl.idleInhibitManager)
    {
        window->wl.idleInhibitor =
            zwp_idle_inhibit_manager_v1_create_inhibitor(
                _glfw.wl.idleInhibitManager, window->wl.surface);
        if (!window->wl.idleInhibitor)
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "Wayland: Failed to create idle inhibitor");
    }
    else if (!enable && window->wl.idleInhibitor)
    {
        zwp_idle_inhibitor_v1_destroy(window->wl.idleInhibitor);
        window->wl.idleInhibitor = NULL;
    }
}